

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

bool __thiscall pstore::storage::request_spans_regions(storage *this,address *addr,size_t size)

{
  segment_type sVar1;
  type paVar2;
  reference pvVar3;
  address lhs;
  reference pvVar4;
  address local_30;
  size_t local_28;
  size_t size_local;
  address *addr_local;
  storage *this_local;
  
  if (size == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_28 = size;
    size_local = (size_t)addr;
    addr_local = (address *)this;
    paVar2 = std::
             unique_ptr<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
             ::operator*(&this->sat_);
    sVar1 = address::segment((address *)size_local);
    pvVar3 = std::array<pstore::sat_entry,_65536UL>::operator[](paVar2,(ulong)sVar1);
    paVar2 = std::
             unique_ptr<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
             ::operator*(&this->sat_);
    lhs = operator+(*(value_type *)size_local,local_28);
    local_30 = operator-(lhs,1);
    sVar1 = address::segment(&local_30);
    pvVar4 = std::array<pstore::sat_entry,_65536UL>::operator[](paVar2,(ulong)sVar1);
    this_local._7_1_ = std::operator!=(&pvVar3->region,&pvVar4->region);
  }
  return this_local._7_1_;
}

Assistant:

inline bool storage::request_spans_regions (address const & addr, std::size_t const size) const
        noexcept {
        (void) addr;
        if (size == 0) {
            return false;
        }
#ifdef PSTORE_ALWAYS_SPANNING
        return true;
#else
        return (*sat_)[addr.segment ()].region != (*sat_)[(addr + size - 1U).segment ()].region;
#endif // PSTORE_ALWAYS_SPANNING
    }